

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O0

void Js::JavascriptArray::ShiftHelper<double>(JavascriptArray *pArr,ScriptContext *scriptContext)

{
  code *pcVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  uint uVar5;
  uint32 maxValue;
  Recycler *recycler_00;
  SparseArraySegmentBase *pSVar6;
  SparseArraySegmentBase **ppSVar7;
  SparseArraySegmentBase *pSVar8;
  undefined4 *puVar9;
  SparseArraySegmentBase *pSVar10;
  uint32 maxGrowSize;
  uint32 offset;
  bool nextIsInlineSegment;
  bool isInlineSegment;
  SparseArraySegment<double> *oldHead;
  SparseArraySegment<double> *head;
  SparseArraySegment<double> *next;
  Recycler *recycler;
  ScriptContext *scriptContext_local;
  JavascriptArray *pArr_local;
  
  recycler_00 = ScriptContext::GetRecycler(scriptContext);
  pSVar6 = Memory::WriteBarrierPtr<Js::SparseArraySegmentBase>::operator->(&pArr->head);
  ppSVar7 = Memory::WriteBarrierPtr::operator_cast_to_SparseArraySegmentBase__
                      ((WriteBarrierPtr *)&pSVar6->next);
  head = SparseArraySegment<double>::From(*ppSVar7);
  while (head != (SparseArraySegment<double> *)0x0) {
    (head->super_SparseArraySegmentBase).left = (head->super_SparseArraySegmentBase).left - 1;
    ppSVar7 = Memory::WriteBarrierPtr::operator_cast_to_SparseArraySegmentBase__
                        ((WriteBarrierPtr *)&(head->super_SparseArraySegmentBase).next);
    head = SparseArraySegment<double>::From(*ppSVar7);
  }
  pSVar6 = Memory::WriteBarrierPtr<Js::SparseArraySegmentBase>::operator->(&pArr->head);
  ppSVar7 = Memory::WriteBarrierPtr::operator_cast_to_SparseArraySegmentBase__
                      ((WriteBarrierPtr *)&pSVar6->next);
  pSVar6 = &SparseArraySegment<double>::From(*ppSVar7)->super_SparseArraySegmentBase;
  if ((pSVar6 != (SparseArraySegmentBase *)0x0) &&
     (pSVar8 = Memory::WriteBarrierPtr<Js::SparseArraySegmentBase>::operator->(&pArr->head),
     pSVar6->left < pSVar8->size)) {
    pSVar8 = Memory::WriteBarrierPtr<Js::SparseArraySegmentBase>::operator->(&pArr->head);
    if (pSVar8->left != 0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar9 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                  ,0x1722,"(pArr->head->left == 0)",
                                  "Array always points to a head starting at index 0");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar9 = 0;
    }
    pSVar8 = Memory::WriteBarrierPtr<Js::SparseArraySegmentBase>::operator->(&pArr->head);
    if (pSVar8->size != pSVar6->left + 1) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar9 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                  ,0x1723,"(pArr->head->size == next->left + 1)",
                                  "Shift next->left overlaps current segment by more than 1 element"
                                 );
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar9 = 0;
    }
    ppSVar7 = Memory::WriteBarrierPtr::operator_cast_to_SparseArraySegmentBase__
                        ((WriteBarrierPtr *)&pArr->head);
    pSVar8 = &SparseArraySegment<double>::From(*ppSVar7)->super_SparseArraySegmentBase;
    bVar2 = IsInlineSegment(pSVar8,pArr);
    bVar3 = IsInlineSegment(pSVar6,pArr);
    oldHead = (SparseArraySegment<double> *)pSVar8;
    if (pSVar6->length != 0) {
      uVar5 = pSVar8->size - 1;
      ppSVar7 = Memory::WriteBarrierPtr::operator_cast_to_SparseArraySegmentBase__
                          ((WriteBarrierPtr *)&pSVar6->next);
      if (*ppSVar7 == (SparseArraySegmentBase *)0x0) {
        oldHead = SparseArraySegment<double>::GrowByMin
                            ((SparseArraySegment<double> *)pSVar8,recycler_00,pSVar6->length - 1);
      }
      else {
        pSVar10 = Memory::WriteBarrierPtr<Js::SparseArraySegmentBase>::operator->(&pSVar6->next);
        if (pSVar10->left < pSVar8->size) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar9 = 1;
          bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                      ,0x1737,"(next->next->left >= head->size)",
                                      "next->next->left >= head->size");
          if (!bVar4) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar9 = 0;
        }
        pSVar10 = Memory::WriteBarrierPtr<Js::SparseArraySegmentBase>::operator->(&pSVar6->next);
        maxValue = pSVar10->left - pSVar8->size;
        if (maxValue == 0) {
          if (pSVar6->length != 1) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar9 = 1;
            bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                        ,0x1740,"(next->length == 1)","next->length == 1");
            if (!bVar4) {
              pcVar1 = (code *)invalidInstructionException();
              (*pcVar1)();
            }
            puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar9 = 0;
          }
        }
        else {
          oldHead = SparseArraySegment<double>::GrowByMinMax
                              ((SparseArraySegment<double> *)pSVar8,recycler_00,pSVar6->length - 1,
                               maxValue);
        }
      }
      Memory::MoveArray<double,double,Memory::Recycler>
                ((double *)(&oldHead[1].super_SparseArraySegmentBase.left + (ulong)uVar5 * 2),
                 (double *)(pSVar6 + 1),(ulong)pSVar6->length);
      (oldHead->super_SparseArraySegmentBase).length = uVar5 + pSVar6->length;
      SparseArraySegmentBase::CheckLengthvsSize(&oldHead->super_SparseArraySegmentBase);
      Memory::WriteBarrierPtr<Js::SparseArraySegmentBase>::operator=
                (&pArr->head,&oldHead->super_SparseArraySegmentBase);
      if ((bVar2) && (pSVar8 != &oldHead->super_SparseArraySegmentBase)) {
        (*(pArr->super_ArrayObject).super_DynamicObject.super_RecyclableObject.
          super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x73])
                  (pArr,pSVar8,0);
      }
    }
    Memory::WriteBarrierPtr<Js::SparseArraySegmentBase>::operator=
              (&(oldHead->super_SparseArraySegmentBase).next,&pSVar6->next);
    if (bVar3) {
      (*(pArr->super_ArrayObject).super_DynamicObject.super_RecyclableObject.super_FinalizableObject
        .super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x73])(pArr,pSVar6,0);
    }
    InvalidateLastUsedSegment(pArr);
    ClearSegmentMap(pArr);
  }
  (*(pArr->super_ArrayObject).super_DynamicObject.super_RecyclableObject.super_FinalizableObject.
    super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x74])();
  return;
}

Assistant:

void JavascriptArray::ShiftHelper(JavascriptArray* pArr, ScriptContext * scriptContext)
    {
        Recycler * recycler = scriptContext->GetRecycler();

        SparseArraySegment<T>* next = SparseArraySegment<T>::From(pArr->head->next);
        while (next)
        {
            next->left--;
            next = SparseArraySegment<T>::From(next->next);
        }

        // head and next might overlap as the next segment left is decremented
        next = SparseArraySegment<T>::From(pArr->head->next);
        if (next && (pArr->head->size > next->left))
        {
            AssertMsg(pArr->head->left == 0, "Array always points to a head starting at index 0");
            AssertMsg(pArr->head->size == next->left + 1, "Shift next->left overlaps current segment by more than 1 element");

            SparseArraySegment<T> *head = SparseArraySegment<T>::From(pArr->head);
            SparseArraySegment<T> *oldHead = head;
            bool isInlineSegment = JavascriptArray::IsInlineSegment(head, pArr);
            bool nextIsInlineSegment = JavascriptArray::IsInlineSegment(next, pArr);
            // Merge the two adjacent segments
            if (next->length != 0)
            {
                uint32 offset = head->size - 1;
                // There is room for one unshifted element in head segment.
                // Hence it's enough if we grow the head segment by next->length - 1

                if (next->next)
                {
                    // If we have a next->next, we can't grow pass the left of that

                    // If the array had a segment map before, the next->next might just be right after next as well.
                    // So we just need to grow to the end of the next segment
                    // TODO: merge that segment too?
                    Assert(next->next->left >= head->size);
                    uint32 maxGrowSize = next->next->left - head->size;
                    if (maxGrowSize != 0)
                    {
                        head = head->GrowByMinMax(recycler, next->length - 1, maxGrowSize); //-1 is to account for unshift
                    }
                    else
                    {
                        // The next segment is only of length one, so we already have space in the header to copy that
                        Assert(next->length == 1);
                    }
                }
                else
                {
                    head = head->GrowByMin(recycler, next->length - 1); //-1 is to account for unshift
                }
                MoveArray(head->elements + offset, next->elements, next->length);
                head->length = offset + next->length;
                head->CheckLengthvsSize();
                pArr->head = head;

                if (isInlineSegment && oldHead != head)
                {
                    pArr->ClearElements(oldHead, 0);
                }
            }
            head->next = next->next;
            if (nextIsInlineSegment)
            {
                pArr->ClearElements(next, 0);
            }

            pArr->InvalidateLastUsedSegment();
            pArr->ClearSegmentMap();
        }

#ifdef VALIDATE_ARRAY
            pArr->ValidateArray();
#endif
    }